

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator.hpp
# Opt level: O2

PhysicalPositionalScan * __thiscall
duckdb::PhysicalOperator::Cast<duckdb::PhysicalPositionalScan>(PhysicalOperator *this)

{
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  if (this->type == POSITIONAL_SCAN) {
    return (PhysicalPositionalScan *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,
             "Failed to cast physical operator to type - physical operator type mismatch",&local_39)
  ;
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET &Cast() {
		if (TARGET::TYPE != PhysicalOperatorType::INVALID && type != TARGET::TYPE) {
			throw InternalException("Failed to cast physical operator to type - physical operator type mismatch");
		}
		return reinterpret_cast<TARGET &>(*this);
	}